

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4e7114::Handlers::beginDict
          (Handlers *this,json_handler_t *start_fn,bare_handler_t *end_fn)

{
  JSONHandler *this_00;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this_00 = this->jh;
  std::function<void_(JSON)>::function((function<void_(JSON)> *)&local_58,start_fn);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_98._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x18) = uStack_40;
  if (local_48 != (code *)0x0) {
    *(void **)local_98._M_unused._0_8_ = local_58._M_unused._M_object;
    *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_58._8_8_;
    *(code **)((long)local_98._M_unused._0_8_ + 0x10) = local_48;
    local_48 = (code *)0x0;
    uStack_40 = 0;
  }
  pcStack_80 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:195:9)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:195:9)>
             ::_M_manager;
  std::function<void_()>::function((function<void_()> *)&local_78,end_fn);
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_38._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 0x18) = uStack_60;
  if (local_68 != (code *)0x0) {
    *(void **)local_38._M_unused._0_8_ = local_78._M_unused._M_object;
    *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = local_78._8_8_;
    *(code **)((long)local_38._M_unused._0_8_ + 0x10) = local_68;
    local_68 = (code *)0x0;
    uStack_60 = 0;
  }
  pcStack_20 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:196:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:196:9)>
             ::_M_manager;
  JSONHandler::addDictHandlers(this_00,(json_handler_t *)&local_98,(void_handler_t *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void
Handlers::beginDict(json_handler_t start_fn, bare_handler_t end_fn)
{
    jh->addDictHandlers(
        [start_fn](std::string const&, JSON j) { start_fn(j); },
        [end_fn](std::string const&) { end_fn(); });
}